

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O1

string * pystring::translate(string *__return_storage_ptr__,string *str,string *table,
                            string *deletechars)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  long lVar5;
  string s;
  int trans_table [256];
  char *local_458;
  size_type local_450;
  char local_448;
  undefined7 uStack_447;
  undefined8 uStack_440;
  int aiStack_438 [258];
  
  local_458 = &local_448;
  local_450 = 0;
  local_448 = '\0';
  sVar1 = str->_M_string_length;
  if (table->_M_string_length == 0x100) {
    sVar4 = deletechars->_M_string_length;
    if (sVar4 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_458);
      if (sVar1 != 0) {
        sVar4 = 0;
        do {
          local_458[sVar4] = (table->_M_dataplus)._M_p[local_458[sVar4]];
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    else {
      pcVar2 = (table->_M_dataplus)._M_p;
      lVar5 = 0;
      do {
        aiStack_438[lVar5] = (int)pcVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x100);
      pcVar2 = (deletechars->_M_dataplus)._M_p;
      sVar3 = 0;
      do {
        aiStack_438[pcVar2[sVar3]] = -1;
        sVar3 = sVar3 + 1;
      } while (sVar4 != sVar3);
      if (sVar1 != 0) {
        sVar4 = 0;
        do {
          if (aiStack_438[(str->_M_dataplus)._M_p[sVar4]] != -1) {
            std::__cxx11::string::push_back((char)&local_458);
          }
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    if (local_458 == &local_448) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_440;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_458;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
    }
    __return_storage_ptr__->_M_string_length = local_450;
    local_450 = 0;
    local_448 = '\0';
    local_458 = &local_448;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458,CONCAT71(uStack_447,local_448) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string translate( const std::string & str, const std::string & table, const std::string & deletechars )
    {
        std::string s;
        std::string::size_type len = str.size(), dellen = deletechars.size();

        if ( table.size() != 256 )
        {
            // TODO : raise exception instead
            return str;
        }

        //if nothing is deleted, use faster code
        if ( dellen == 0 )
        {
            s = str;
            for ( std::string::size_type i = 0; i < len; ++i )
            {
                s[i] = table[ s[i] ];
            }
            return s;
        }


        int trans_table[256];
        for ( int i = 0; i < 256; i++)
        {
            trans_table[i] = table[i];
        }

        for ( std::string::size_type i = 0; i < dellen; i++)
        {
            trans_table[(int) deletechars[i] ] = -1;
        }

        for ( std::string::size_type i = 0; i < len; ++i )
        {
            if ( trans_table[ (int) str[i] ] != -1 )
            {
                s += table[ str[i] ];
            }
        }

        return s;

    }